

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_str.c
# Opt level: O0

void addstr(lua_State *L,SBuf *sb,char *str,MSize len)

{
  long lVar1;
  void *pvVar2;
  uint in_ECX;
  long in_RDX;
  long *in_RSI;
  MSize sz;
  MSize i;
  char *p;
  uint uVar3;
  MSize in_stack_ffffffffffffffd4;
  uint uVar4;
  void *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (*(uint *)((long)in_RSI + 0xc) < (int)in_RSI[1] + in_ECX) {
    uVar3 = *(uint *)((long)in_RSI + 0xc);
    do {
      uVar3 = uVar3 << 1;
    } while (uVar3 < (int)in_RSI[1] + in_ECX);
    pvVar2 = lj_mem_realloc((lua_State *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,uVar3);
    *in_RSI = (long)pvVar2;
    *(uint *)((long)in_RSI + 0xc) = uVar3;
  }
  lVar1 = *in_RSI;
  uVar3 = *(uint *)(in_RSI + 1);
  *(uint *)(in_RSI + 1) = in_ECX + (int)in_RSI[1];
  for (uVar4 = 0; uVar4 < in_ECX; uVar4 = uVar4 + 1) {
    *(undefined1 *)(lVar1 + (ulong)uVar3 + (ulong)uVar4) = *(undefined1 *)(in_RDX + (ulong)uVar4);
  }
  return;
}

Assistant:

static void addstr(lua_State *L, SBuf *sb, const char *str, MSize len)
{
  char *p;
  MSize i;
  if (sb->n + len > sb->sz) {
    MSize sz = sb->sz * 2;
    while (sb->n + len > sz) sz = sz * 2;
    lj_str_resizebuf(L, sb, sz);
  }
  p = sb->buf + sb->n;
  sb->n += len;
  for (i = 0; i < len; i++) p[i] = str[i];
}